

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

int Sle_ManCutHasPisOnly(int *pCut,Vec_Bit_t *vMask)

{
  int iVar1;
  int *piVar2;
  int *pC;
  int k;
  Vec_Bit_t *vMask_local;
  int *pCut_local;
  
  piVar2 = Sle_CutLeaves(pCut);
  pC._4_4_ = 0;
  while( true ) {
    iVar1 = Sle_CutSize(pCut);
    if (iVar1 <= pC._4_4_) {
      return 1;
    }
    iVar1 = Vec_BitEntry(vMask,piVar2[pC._4_4_]);
    if (iVar1 != 0) break;
    pC._4_4_ = pC._4_4_ + 1;
  }
  return 0;
}

Assistant:

int Sle_ManCutHasPisOnly( int * pCut, Vec_Bit_t * vMask )
{
    int k, * pC = Sle_CutLeaves(pCut);
    for ( k = 0; k < Sle_CutSize(pCut); k++ )
        if ( Vec_BitEntry(vMask, pC[k]) ) // internal node
            return 0;
    return 1;
}